

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit.c
# Opt level: O0

ch_dataptr ch_emit_commit_scope(ch_emit *emit)

{
  ch_emit_scope *blob;
  ch_dataptr cVar1;
  ch_dataptr function_ptr;
  ch_blob *bytecode;
  ch_emit *emit_local;
  
  blob = emit->emit_scope;
  cVar1 = ch_emit_write(&emit->function_bytecode,(blob->bytecode).start,
                        (long)(blob->bytecode).current - (long)(blob->bytecode).start);
  free_blob(&blob->bytecode);
  emit->emit_scope = emit->emit_scope->parent;
  return cVar1;
}

Assistant:

ch_dataptr ch_emit_commit_scope(ch_emit *emit) {
  // TODO check if function_ptr exceeds UINT32_MAX (of ch_dataptr)
  // TODO check if emit_scope is not NULL

  ch_blob *bytecode = &emit->emit_scope->bytecode;
  ch_dataptr function_ptr = ch_emit_write(
      &emit->function_bytecode, bytecode->start, CH_BLOB_CONTENT_SIZE(bytecode));

  free_blob(bytecode);
  emit->emit_scope = emit->emit_scope->parent;

  return function_ptr;
}